

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# W_final.cpp
# Opt level: O0

void __thiscall W_final::space_allocation(W_final *this)

{
  undefined1 auVar1 [16];
  int (*paiVar2) [8];
  ulong uVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char __c;
  void *pvVar5;
  long in_RDI;
  allocator<char> *in_stack_fffffffffffffef8;
  undefined1 *__n;
  vrna_param_t *local_d8;
  vrna_param_t *params;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  short *in_stack_ffffffffffffff58;
  cand_pos_t in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  s_energy_matrix *in_stack_ffffffffffffff70;
  short *in_stack_ffffffffffffff78;
  short *in_stack_ffffffffffffff80;
  s_energy_matrix *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  pseudo_loop *in_stack_ffffffffffffffa0;
  vrna_param_t *in_stack_ffffffffffffffb0;
  string local_38 [56];
  
  uVar3 = (ulong)(*(int *)(in_RDI + 0x50) + 1);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  local_d8 = (vrna_param_t *)operator_new__(uVar4);
  params = local_d8;
  if (uVar3 != 0) {
    paiVar2 = local_d8->stack;
    do {
      minimum_fold::minimum_fold((minimum_fold *)local_d8);
      local_d8 = (vrna_param_t *)local_d8->stack;
    } while (local_d8 != (vrna_param_t *)((long)(paiVar2 + -1) + 0x1c + uVar3 * 4));
  }
  *(vrna_param_t **)(in_RDI + 0x60) = params;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0xb8);
  std::__cxx11::string::string(local_38,(string *)(in_RDI + 0x68));
  s_energy_matrix::s_energy_matrix
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
             in_stack_ffffffffffffff58,
             (short *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),params);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDI + 0x30) = this_00;
  std::__cxx11::string::~string(local_38);
  __c = (char)(*(int *)(in_RDI + 0x50) + 1 >> 0x1f);
  __n = &stack0xffffffffffffff9f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(size_type)__n,__c,in_stack_fffffffffffffef8);
  std::__cxx11::string::operator=((string *)(in_RDI + 8),(string *)&stack0xffffffffffffffa0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  pvVar5 = operator_new(0x188);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff78,(string *)(in_RDI + 0x68));
  std::__cxx11::string::string((string *)&stack0xffffffffffffff58,(string *)(in_RDI + 0x88));
  pseudo_loop::pseudo_loop
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffffb0);
  *(void **)(in_RDI + 0x28) = pvVar5;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  return;
}

Assistant:

void W_final::space_allocation(){

	// From simfold
	f = new minimum_fold [n+1];

    V = new s_energy_matrix (seq_, n,S_,S1_,params_);
	structure = std::string (n+1,'.');

	// Hosna: June 20th 2007
    WMB = new pseudo_loop (seq_,res,V,S_,S1_,params_);

}